

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

istream * operator>>(istream *i,Address *a)

{
  undefined1 local_78 [8];
  string street1;
  string city1;
  string country1;
  Address *a_local;
  istream *i_local;
  
  std::__cxx11::string::string((string *)(city1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(street1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  std::operator<<((ostream *)&std::cout,"Enter country: ");
  std::operator>>(i,(string *)(city1.field_2._M_local_buf + 8));
  std::operator<<((ostream *)&std::cout,"Enter city: ");
  std::operator>>(i,(string *)(street1.field_2._M_local_buf + 8));
  std::operator<<((ostream *)&std::cout,"Enter street: ");
  std::operator>>(i,(string *)local_78);
  Address::setCountry(a,(string *)((long)&city1.field_2 + 8));
  Address::setCity(a,(string *)((long)&street1.field_2 + 8));
  Address::setStreet(a,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(street1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(city1.field_2._M_local_buf + 8));
  return i;
}

Assistant:

istream& operator >>(istream& i, Address& a) {

    string country1, city1, street1;
    cout << "Enter country: ";
    i >> country1;
    cout << "Enter city: ";
    i >> city1;
    cout << "Enter street: ";
    i >> street1;
    a.setCountry(country1);
    a.setCity(city1);
    a.setStreet(street1);
    return i;
}